

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObject::dumpObjectInfo(QObject *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Type pCVar4;
  Type this_00;
  Type pQVar5;
  char *pcVar6;
  QObject *in_RDI;
  long in_FS_OFFSET;
  Connection *s;
  QMetaObject *receiverMetaObject;
  Connection *c;
  int signal_index;
  SignalVector *signalVector;
  ConnectionData *cd;
  QObjectPrivate *d;
  QMetaMethod slot;
  QByteArray slotName;
  QMetaMethod method;
  QMetaMethod signal;
  QMutexLocker<QBasicMutex> locker;
  DataPointer *in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  QMetaMethod *in_stack_fffffffffffffbc8;
  ConnectionData *in_stack_fffffffffffffbd0;
  QMetaObject *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  char *local_3e0;
  char *local_370;
  bool local_352;
  Connection *local_350;
  byte bVar7;
  byte bVar8;
  Connection *local_338;
  uint local_32c;
  bool local_30e;
  QMessageLogger local_2f8;
  QString local_2d8 [3];
  QMessageLogger local_290;
  QMetaMethod local_258;
  QArrayDataPointer<char> local_240;
  undefined1 *local_228;
  undefined1 *puStack_220;
  undefined1 *local_218;
  QMessageLogger local_208;
  QMessageLogger local_1e8;
  QString local_1b0 [3];
  QMessageLogger local_168;
  QMetaMethod local_148;
  QMessageLogger local_130;
  QMessageLogger local_110;
  QMessageLogger local_d8;
  __sighandler_t local_b8;
  undefined1 *puStack_b0;
  QMessageLogger local_a0 [3];
  QMessageLogger local_38;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
             (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(char *)in_stack_fffffffffffffbb8);
  (**in_RDI->_vptr_QObject)();
  pcVar3 = QMetaObject::className((QMetaObject *)in_stack_fffffffffffffbb8);
  objectName((QObject *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  local_30e = QString::isEmpty((QString *)0x3f8419);
  if (local_30e) {
    local_370 = "unnamed";
  }
  else {
    objectName((QObject *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    QString::toLocal8Bit((QString *)in_stack_fffffffffffffbd8);
    local_370 = QByteArray::data((QByteArray *)in_stack_fffffffffffffbc0);
  }
  local_30e = !local_30e;
  QMessageLogger::debug(&local_38,"OBJECT %s::%s",pcVar3,local_370);
  if (local_30e) {
    QByteArray::~QByteArray((QByteArray *)0x3f84e8);
    QString::~QString((QString *)0x3f8501);
  }
  QString::~QString((QString *)0x3f850e);
  d_func((QObject *)0x3f851b);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  signalSlotLock(in_RDI);
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)in_stack_fffffffffffffbc0,
             (QBasicMutex *)in_stack_fffffffffffffbb8);
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
             (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(char *)in_stack_fffffffffffffbb8);
  QMessageLogger::debug(local_a0,"  SIGNALS OUT");
  pCVar4 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                     ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3f858e);
  if ((pCVar4 == (Type)0x0) ||
     (iVar2 = QObjectPrivate::ConnectionData::signalVectorCount
                        ((ConnectionData *)in_stack_fffffffffffffbc0), iVar2 < 1)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
               (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(char *)in_stack_fffffffffffffbb8);
    QMessageLogger::debug(&local_1e8,"        <None>");
  }
  else {
    this_00 = QBasicAtomicPointer<QObjectPrivate::SignalVector>::loadRelaxed
                        ((QBasicAtomicPointer<QObjectPrivate::SignalVector> *)0x3f85dc);
    local_32c = 0;
    while( true ) {
      iVar2 = QObjectPrivate::SignalVector::count(this_00);
      if (iVar2 <= (int)local_32c) break;
      QObjectPrivate::SignalVector::at(this_00,local_32c);
      local_338 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                            ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3f8654);
      if (local_338 != (Type)0x0) {
        local_b8 = (__sighandler_t)&DAT_aaaaaaaaaaaaaaaa;
        puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
        iVar2 = (**in_RDI->_vptr_QObject)();
        local_b8 = QMetaObjectPrivate::signal(iVar2,(__sighandler_t)(ulong)local_32c);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                   (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(char *)in_stack_fffffffffffffbb8
                  );
        QMetaMethod::methodSignature(in_stack_fffffffffffffbc8);
        pcVar3 = QByteArray::constData((QByteArray *)0x3f87ca);
        QMessageLogger::debug(&local_d8,"        signal: %s",pcVar3);
        QByteArray::~QByteArray((QByteArray *)0x3f87f2);
        while (local_338 != (Connection *)0x0) {
          pQVar5 = QBasicAtomicPointer<QObject>::loadRelaxed
                             ((QBasicAtomicPointer<QObject> *)0x3f8812);
          iVar2 = (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
          if (pQVar5 == (Type)0x0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8
                       ,iVar2,(char *)in_stack_fffffffffffffbb8);
            QMessageLogger::debug(&local_110,"          <Disconnected receiver>");
            local_338 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                                  ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3f8857);
          }
          else if ((*(uint *)&local_338->field_0x54 >> 0x1d & 1) == 0) {
            pQVar5 = QBasicAtomicPointer<QObject>::loadRelaxed
                               ((QBasicAtomicPointer<QObject> *)0x3f88ff);
            (**pQVar5->_vptr_QObject)();
            local_148.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
            local_148.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
            QObjectPrivate::Connection::method(local_338);
            local_148 = QMetaObject::method(in_stack_fffffffffffffbd8,
                                            (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8
                       ,(int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                       (char *)in_stack_fffffffffffffbb8);
            pcVar3 = QMetaObject::className((QMetaObject *)in_stack_fffffffffffffbb8);
            QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x3f89d4);
            bVar8 = 0;
            bVar7 = 0;
            objectName((QObject *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
            bVar1 = QString::isEmpty((QString *)0x3f8a03);
            if (bVar1) {
              local_3e0 = "unnamed";
            }
            else {
              QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x3f8a28);
              objectName((QObject *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
              bVar8 = 1;
              QtPrivate::asString(local_1b0);
              QString::toLocal8Bit((QString *)in_stack_fffffffffffffbd8);
              bVar7 = 1;
              local_3e0 = QByteArray::constData((QByteArray *)0x3f8a7f);
            }
            QMetaMethod::methodSignature(in_stack_fffffffffffffbc8);
            pcVar6 = QByteArray::constData((QByteArray *)0x3f8ab2);
            QMessageLogger::debug(&local_168,"          --> %s::%s %s",pcVar3,local_3e0,pcVar6);
            QByteArray::~QByteArray((QByteArray *)0x3f8ae4);
            if ((bVar7 & 1) != 0) {
              QByteArray::~QByteArray((QByteArray *)0x3f8afd);
            }
            if ((bVar8 & 1) != 0) {
              QString::~QString((QString *)0x3f8b16);
            }
            QString::~QString((QString *)0x3f8b23);
            local_338 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                                  ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3f8b34);
          }
          else {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8
                       ,iVar2,(char *)in_stack_fffffffffffffbb8);
            QMessageLogger::debug(&local_130,"          <functor or function pointer>");
            local_338 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                                  ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3f88e1);
          }
        }
      }
      local_32c = local_32c + 1;
    }
  }
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
             (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(char *)in_stack_fffffffffffffbb8);
  QMessageLogger::debug(&local_208,"  SIGNALS IN");
  if ((pCVar4 == (Type)0x0) || (pCVar4->senders == (Connection *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
               (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(char *)in_stack_fffffffffffffbb8);
    QMessageLogger::debug(&local_2f8,"        <None>");
  }
  else {
    for (local_350 = pCVar4->senders; local_350 != (Connection *)0x0;
        local_350 = (local_350->super_ConnectionOrSignalVector).field_0.next) {
      local_228 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_220 = &DAT_aaaaaaaaaaaaaaaa;
      local_218 = &DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<char>::QArrayDataPointer(&local_240,(Data *)0x0,"<unknown>",9);
      QByteArray::QByteArray((QByteArray *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)in_stack_fffffffffffffbc0);
      if ((*(uint *)&local_350->field_0x54 >> 0x1d & 1) == 0) {
        local_258.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
        local_258.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
        (**in_RDI->_vptr_QObject)();
        in_stack_fffffffffffffbfc = QObjectPrivate::Connection::method(local_350);
        local_258 = QMetaObject::method(in_stack_fffffffffffffbd8,
                                        (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        QMetaMethod::methodSignature(in_stack_fffffffffffffbc8);
        QByteArray::operator=
                  ((QByteArray *)in_stack_fffffffffffffbc0,(QByteArray *)in_stack_fffffffffffffbb8);
        QByteArray::~QByteArray((QByteArray *)0x3f8de1);
      }
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                 (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),(char *)in_stack_fffffffffffffbb8);
      (**local_350->sender->_vptr_QObject)();
      in_stack_fffffffffffffbd8 =
           (QMetaObject *)QMetaObject::className((QMetaObject *)in_stack_fffffffffffffbb8);
      objectName((QObject *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      local_352 = QString::isEmpty((QString *)0x3f8ea4);
      if (local_352) {
        in_stack_fffffffffffffbc0 = "unnamed";
      }
      else {
        objectName((QObject *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        in_stack_fffffffffffffbc8 = (QMetaMethod *)QtPrivate::asString(local_2d8);
        QString::toLocal8Bit((QString *)in_stack_fffffffffffffbd8);
        in_stack_fffffffffffffbc0 = QByteArray::constData((QByteArray *)0x3f8f18);
      }
      local_352 = !local_352;
      in_stack_fffffffffffffbd0 = (ConnectionData *)in_stack_fffffffffffffbc0;
      pcVar3 = QByteArray::constData((QByteArray *)0x3f8f34);
      QMessageLogger::debug
                (&local_290,"          <-- %s::%s %s",in_stack_fffffffffffffbd8,
                 in_stack_fffffffffffffbc0,pcVar3);
      if (local_352) {
        QByteArray::~QByteArray((QByteArray *)0x3f8f72);
        QString::~QString((QString *)0x3f8f8b);
      }
      QString::~QString((QString *)0x3f8f98);
      QByteArray::~QByteArray((QByteArray *)0x3f8fa5);
    }
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)in_stack_fffffffffffffbc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObject::dumpObjectInfo() const
{
    qDebug("OBJECT %s::%s", metaObject()->className(),
           objectName().isEmpty() ? "unnamed" : objectName().toLocal8Bit().data());

    Q_D(const QObject);
    QMutexLocker locker(signalSlotLock(this));

    // first, look for connections where this object is the sender
    qDebug("  SIGNALS OUT");

    QObjectPrivate::ConnectionData *cd = d->connections.loadRelaxed();
    if (cd && cd->signalVectorCount() > 0) {
        QObjectPrivate::SignalVector *signalVector = cd->signalVector.loadRelaxed();
        for (int signal_index = 0; signal_index < signalVector->count(); ++signal_index) {
            const QObjectPrivate::Connection *c = signalVector->at(signal_index).first.loadRelaxed();
            if (!c)
                continue;
            const QMetaMethod signal = QMetaObjectPrivate::signal(metaObject(), signal_index);
            qDebug("        signal: %s", signal.methodSignature().constData());

            // receivers
            while (c) {
                if (!c->receiver.loadRelaxed()) {
                    qDebug("          <Disconnected receiver>");
                    c = c->nextConnectionList.loadRelaxed();
                    continue;
                }
                if (c->isSlotObject) {
                    qDebug("          <functor or function pointer>");
                    c = c->nextConnectionList.loadRelaxed();
                    continue;
                }
                const QMetaObject *receiverMetaObject = c->receiver.loadRelaxed()->metaObject();
                const QMetaMethod method = receiverMetaObject->method(c->method());
                qDebug("          --> %s::%s %s",
                       receiverMetaObject->className(),
                       c->receiver.loadRelaxed()->objectName().isEmpty() ? "unnamed" : qPrintable(c->receiver.loadRelaxed()->objectName()),
                       method.methodSignature().constData());
                c = c->nextConnectionList.loadRelaxed();
            }
        }
    } else {
        qDebug( "        <None>" );
    }

    // now look for connections where this object is the receiver
    qDebug("  SIGNALS IN");

    if (cd && cd->senders) {
        for (QObjectPrivate::Connection *s = cd->senders; s; s = s->next) {
            QByteArray slotName = QByteArrayLiteral("<unknown>");
            if (!s->isSlotObject) {
                const QMetaMethod slot = metaObject()->method(s->method());
                slotName = slot.methodSignature();
            }
            qDebug("          <-- %s::%s %s",
                   s->sender->metaObject()->className(),
                   s->sender->objectName().isEmpty() ? "unnamed" : qPrintable(s->sender->objectName()),
                   slotName.constData());
        }
    } else {
        qDebug("        <None>");
    }
}